

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall
cppgenerate::Class::printConstructors
          (Class *this,ostream *stream,AccessModifier modifier,bool signatureOnly)

{
  bool bVar1;
  bool bVar2;
  AccessModifier AVar3;
  reference other;
  ostream *this_00;
  undefined1 local_228 [8];
  Constructor constructor;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_> *__range1;
  string local_40 [8];
  string accessString;
  bool havePrinted;
  bool signatureOnly_local;
  AccessModifier modifier_local;
  ostream *stream_local;
  Class *this_local;
  
  bVar1 = false;
  std::__cxx11::string::string(local_40);
  if (modifier == PUBLIC) {
    std::__cxx11::string::operator=(local_40,"public:");
  }
  else if (modifier == PRIVATE) {
    std::__cxx11::string::operator=(local_40,"private:");
  }
  else if (modifier == PROTECTED) {
    std::__cxx11::string::operator=(local_40,"protected:");
  }
  __end1 = std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::begin
                     (&this->m_constructors);
  constructor._440_8_ =
       std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::end
                 (&this->m_constructors);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cppgenerate::Constructor_*,_std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>_>
                                     *)&constructor.m_accessModifier), bVar2) {
    other = __gnu_cxx::
            __normal_iterator<const_cppgenerate::Constructor_*,_std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>_>
            ::operator*(&__end1);
    Constructor::Constructor((Constructor *)local_228,other);
    AVar3 = Constructor::accessModifier((Constructor *)local_228);
    if (AVar3 == modifier) {
      if (!bVar1) {
        this_00 = std::operator<<(stream,local_40);
        std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
        bVar1 = true;
      }
      if (signatureOnly) {
        Constructor::printSignature((Constructor *)local_228,this,stream,false);
      }
      else {
        Constructor::printImplementation((Constructor *)local_228,this,stream,true);
      }
    }
    Constructor::~Constructor((Constructor *)local_228);
    __gnu_cxx::
    __normal_iterator<const_cppgenerate::Constructor_*,_std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Class::printConstructors( std::ostream& stream, AccessModifier modifier, bool signatureOnly ) const{
    bool havePrinted = false;
    std::string accessString;

    switch( modifier ){
    case cppgenerate::AccessModifier::PRIVATE: accessString = "private:"; break;
    case cppgenerate::AccessModifier::PUBLIC: accessString = "public:"; break;
    case cppgenerate::AccessModifier::PROTECTED: accessString = "protected:"; break;
    }

    for( cppgenerate::Constructor constructor : m_constructors ){
        if( constructor.accessModifier() != modifier ) continue;
        if( !havePrinted ){
            stream << accessString << std::endl;
            havePrinted = true;
        }
        if( signatureOnly ){
            constructor.printSignature( this, stream, false );
        }else{
            constructor.printImplementation( this, stream, true );
        }
    }
}